

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

string * __thiscall
Kraken::b64_encode_abi_cxx11_
          (string *__return_storage_ptr__,Kraken *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  ulong uVar1;
  char *pcVar2;
  BIO_METHOD *pBVar3;
  BIO *b;
  uchar *data_00;
  size_type sVar4;
  allocator local_32;
  undefined1 local_31;
  ulong *local_30;
  BUF_MEM *bptr;
  BIO *bmem;
  BIO *b64;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  string *output;
  
  b64 = (BIO *)this;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  pBVar3 = BIO_f_base64();
  bmem = (BIO *)BIO_new(pBVar3);
  BIO_set_flags((BIO *)bmem,0x100);
  pBVar3 = BIO_s_mem();
  bptr = (BUF_MEM *)BIO_new(pBVar3);
  b = BIO_push((BIO *)bmem,(BIO *)bptr);
  bmem = (BIO *)b;
  data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)b64);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)b64);
  BIO_write(b,data_00,(int)sVar4);
  BIO_ctrl((BIO *)bmem,0xb,0,(void *)0x0);
  local_30 = (ulong *)0x0;
  BIO_ctrl((BIO *)bmem,0x73,0,&local_30);
  local_31 = 0;
  uVar1 = *local_30;
  pcVar2 = (char *)local_30[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar1,&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  BIO_free_all((BIO *)bmem);
  return __return_storage_ptr__;
}

Assistant:

static std::string b64_encode(const std::vector<unsigned char>& data) 
{
   BIO* b64 = BIO_new(BIO_f_base64());
   BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);

   BIO* bmem = BIO_new(BIO_s_mem());
   b64 = BIO_push(b64, bmem);
   
   BIO_write(b64, data.data(), data.size());
   BIO_flush(b64);

   BUF_MEM* bptr = NULL;
   BIO_get_mem_ptr(b64, &bptr);
   
   std::string output(bptr->data, bptr->length);
   BIO_free_all(b64);

   return output;
}